

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyUint64Int32_2(void)

{
  bool bVar1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si2;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  TestCase<int,_unsigned_long,_2> test;
  TestVector<int,_unsigned_long,_2> tests;
  TestVector<int,_unsigned_long,_2> *in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff79;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff80;
  allocator local_79;
  string local_78 [52];
  int local_44;
  int local_40;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_3c;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_38;
  byte local_31;
  int local_30 [3];
  undefined1 expected;
  byte in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  int in_stack_ffffffffffffffec;
  string *in_stack_fffffffffffffff0;
  
  TestVector<int,_unsigned_long,_2>::TestVector
            ((TestVector<int,_unsigned_long,_2> *)&stack0xffffffffffffffe8);
  TestVector<int,_unsigned_long,_2>::GetNext(in_stack_ffffffffffffff70);
  while( true ) {
    expected = (undefined1)((ulong)stack0xffffffffffffffd8 >> 0x38);
    bVar1 = TestVector<int,_unsigned_long,_2>::Done
                      ((TestVector<int,_unsigned_long,_2> *)&stack0xffffffffffffffe8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_31 = 1;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_38,local_30);
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_3c);
    local_44 = local_38.m_int;
    local_40 = (int)operator/(CONCAT71(in_stack_ffffffffffffff79,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff80);
    local_3c = (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )local_40;
    if ((local_31 & 1) != (in_stack_ffffffffffffffe0 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"Error in case int32_uint64_2 throw: ",&local_79);
      err_msg<int,unsigned_long>
                (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                 CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),(bool)expected);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    TestVector<int,_unsigned_long,_2>::GetNext(in_stack_ffffffffffffff70);
    unique0x1000019f = in_stack_ffffffffffffff70;
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffff78;
  }
  return;
}

Assistant:

void DivVerifyUint64Int32_2()
{
    TestVector< std::int32_t, std::uint64_t, OpType::Div2 > tests;
    TestCase< std::int32_t, std::uint64_t, OpType::Div2 > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int32_t> si(test.x);
         SafeInt<std::int32_t> si2;

         si2 = test.y / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case int32_uint64_2 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}